

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_msg.h
# Opt level: O3

void __thiscall spdlog::details::log_msg::log_msg(log_msg *this,string *loggers_name,level_enum lvl)

{
  rep rVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  this->logger_name = loggers_name;
  this->level = lvl;
  (this->time).__d.__r = 0;
  (this->raw).super_BasicWriter<char>.buffer_ = &(this->raw).buffer_.super_Buffer<char>;
  (this->raw).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001aefb8;
  (this->raw).buffer_.super_Buffer<char>.ptr_ = (this->raw).buffer_.data_;
  (this->raw).buffer_.super_Buffer<char>.size_ = 0;
  (this->raw).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->raw).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001af000;
  (this->formatted).super_BasicWriter<char>.buffer_ = &(this->formatted).buffer_.super_Buffer<char>;
  (this->formatted).super_BasicWriter<char>._vptr_BasicWriter =
       (_func_int **)&PTR__BasicMemoryWriter_001aefb8;
  (this->formatted).buffer_.super_Buffer<char>.ptr_ = (this->formatted).buffer_.data_;
  (this->formatted).buffer_.super_Buffer<char>.size_ = 0;
  (this->formatted).buffer_.super_Buffer<char>.capacity_ = 500;
  (this->formatted).buffer_.super_Buffer<char>._vptr_Buffer = (_func_int **)&PTR_grow_001af000;
  this->msg_id = 0;
  this->color_range_start = 0;
  this->color_range_end = 0;
  rVar1 = std::chrono::_V2::system_clock::now();
  (this->time).__d.__r = rVar1;
  if (*(char *)(in_FS_OFFSET + -8) == '\0') {
    sVar2 = syscall(0xba);
    *(size_t *)(in_FS_OFFSET + -0x10) = sVar2;
    *(undefined1 *)(in_FS_OFFSET + -8) = 1;
  }
  else {
    sVar2 = *(size_t *)(in_FS_OFFSET + -0x10);
  }
  this->thread_id = sVar2;
  return;
}

Assistant:

log_msg(const std::string *loggers_name, level::level_enum lvl)
        : logger_name(loggers_name)
        , level(lvl)
    {
#ifndef SPDLOG_NO_DATETIME
        time = os::now();
#endif

#ifndef SPDLOG_NO_THREAD_ID
        thread_id = os::thread_id();
#endif
    }